

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.c
# Opt level: O2

statemachine_definition * statemachine_definition_new(int states)

{
  statemachine_definition *psVar1;
  state_event_function *pp_Var2;
  size_t __nmemb;
  
  psVar1 = (statemachine_definition *)malloc(0x30);
  if (psVar1 != (statemachine_definition *)0x0) {
    __nmemb = (size_t)states;
    pp_Var2 = (state_event_function *)calloc(__nmemb,8);
    psVar1->in_state_events = pp_Var2;
    if (pp_Var2 != (state_event_function *)0x0) {
      pp_Var2 = (state_event_function *)calloc(__nmemb,8);
      psVar1->enter_state_events = pp_Var2;
      if (pp_Var2 != (state_event_function *)0x0) {
        pp_Var2 = (state_event_function *)calloc(__nmemb,8);
        psVar1->exit_state_events = pp_Var2;
        if (pp_Var2 != (state_event_function *)0x0) {
          psVar1->num_states = states;
          psVar1->state_names = (char **)0x0;
          return psVar1;
        }
      }
    }
  }
  return (statemachine_definition *)0x0;
}

Assistant:

statemachine_definition *statemachine_definition_new(int states)
{
    statemachine_definition *def;
    def = CAST(statemachine_definition *,
               malloc(sizeof(statemachine_definition)));
    if (def == NULL)
      return NULL;

    def->in_state_events = CAST(state_event_function *,
                                calloc(states, sizeof(state_event_function)));
    if (def->in_state_events == NULL)
      return NULL;

    def->enter_state_events =CAST(state_event_function *,
                                   calloc(states,
                                          sizeof(state_event_function)));
    if (def->enter_state_events == NULL)
      return NULL;

    def->exit_state_events = CAST(state_event_function *,
                                  calloc(states, sizeof(state_event_function)));
    if (def->exit_state_events == NULL)
      return NULL;

    def->num_states = states;
    def->state_names = NULL;
    return def;
}